

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void * __thiscall ncnn::UnlockedPoolAllocator::fastMalloc(UnlockedPoolAllocator *this,size_t size)

{
  size_t *psVar1;
  UnlockedPoolAllocatorPrivate *pUVar2;
  bool bVar3;
  int iVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  void *ptr;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  p_Var7 = (_List_node_base *)&this->d->budgets;
  local_38 = (_List_node_base *)size;
  do {
    p_Var7 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    pUVar2 = this->d;
    if (p_Var7 == (_List_node_base *)&pUVar2->budgets) {
      local_40 = (_List_node_base *)0x0;
      iVar4 = posix_memalign(&local_40,0x10,(size_t)(size + 0x40));
      if (iVar4 != 0) {
        local_40 = (_List_node_base *)0x0;
      }
      p_Var7 = local_40;
      pUVar2 = this->d;
      p_Var6 = (_List_node_base *)operator_new(0x20);
      p_Var6[1]._M_next = (_List_node_base *)size;
      p_Var6[1]._M_prev = p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(pUVar2->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return p_Var7;
    }
    p_Var6 = p_Var7[1]._M_next;
    bVar3 = true;
    if ((size <= p_Var6) &&
       ((_List_node_base *)((ulong)pUVar2->size_compare_ratio * (long)p_Var6 >> 8) <= size)) {
      local_48 = p_Var7[1]._M_prev;
      psVar1 = &(pUVar2->budgets).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var7,0x20);
      pUVar2 = this->d;
      p_Var5 = (_List_node_base *)operator_new(0x20);
      p_Var5[1]._M_next = p_Var6;
      p_Var5[1]._M_prev = local_48;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(pUVar2->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      bVar3 = false;
      size = (size_t)local_38;
    }
  } while (bVar3);
  return local_48;
}

Assistant:

void* UnlockedPoolAllocator::fastMalloc(size_t size)
{
    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->payouts.push_back(std::make_pair(bs, ptr));

            return ptr;
        }
    }

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts.push_back(std::make_pair(size, ptr));

    return ptr;
}